

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void pubkeyFieldTest(Pubkey *pubkey,PubkeyTestVector *test_vector)

{
  bool bVar1;
  Message *pMVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  
  pcVar3 = (test_vector->hex)._M_dataplus._M_p;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&gtest_ar_1,pubkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"test_vector.hex.c_str()","pubkey.GetHex().c_str()",pcVar3,
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::core::Pubkey::IsValid(pubkey);
  gtest_ar.success_ = !bVar1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_1,"test_vector.expect_invalid","!pubkey.IsValid()",
             &test_vector->expect_invalid,&gtest_ar.success_);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    this = &gtest_ar_1.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    gtest_ar.success_ = cfd::core::Pubkey::IsCompress(pubkey);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_1,"test_vector.expect_compress","pubkey.IsCompress()",
               &test_vector->expect_compress,&gtest_ar.success_);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      std::operator<<((ostream *)(CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 0x10)," : ");
      gtest_ar_._0_8_ = (test_vector->hex)._M_dataplus._M_p;
      pMVar2 = testing::Message::operator<<((Message *)&gtest_ar,(char **)&gtest_ar_);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [4])" : ");
      pMVar2 = testing::Message::operator<<(pMVar2,test_vector->expect_compress);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
                 ,0x4b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::Pubkey::GetData((ByteData *)&gtest_ar_1,pubkey);
    cfd::core::ByteData::ByteData((ByteData *)&gtest_ar,&test_vector->hex);
    bVar1 = cfd::core::ByteData::Equals((ByteData *)&gtest_ar_1,(ByteData *)&gtest_ar);
    this = &gtest_ar_.message_;
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
    if (!bVar1) {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                 (AssertionResult *)"pubkey.GetData().Equals(ByteData(test_vector.hex))","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
                 ,0x4e,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this);
  return;
}

Assistant:

void pubkeyFieldTest(Pubkey pubkey, PubkeyTestVector test_vector) {
  EXPECT_STREQ(test_vector.hex.c_str(), pubkey.GetHex().c_str());
  ASSERT_EQ(test_vector.expect_invalid, !pubkey.IsValid());
  EXPECT_EQ(test_vector.expect_compress, pubkey.IsCompress())
      << " : " << test_vector.hex.c_str() << " : "
      << test_vector.expect_compress;
  EXPECT_TRUE(pubkey.GetData().Equals(ByteData(test_vector.hex)));
}